

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_groups.cxx
# Opt level: O0

void __thiscall xray_re::xr_group_object::load(xr_group_object *this,xr_reader *r)

{
  xr_reader *pxVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  xr_scene *this_00;
  byte local_31;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_group_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar4 = xr_reader::r_chunk<unsigned_short>(r,0,&local_1a);
  if (sVar4 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                  ,0x12,"virtual void xray_re::xr_group_object::load(xr_reader &)");
  }
  if (local_1a != 0x11) {
    __assert_fail("version == GROUPOBJ_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                  ,0x13,"virtual void xray_re::xr_group_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
  xr_reader::r_chunk<unsigned_int>(pxStack_18,3,(uint *)&(this->super_xr_custom_object).field_0x6c);
  if ((*(uint *)&(this->super_xr_custom_object).field_0x6c & 1) == 0) {
    this_00 = xr_custom_object::scene(&this->super_xr_custom_object);
    xr_scene::load_objects(this_00,pxStack_18,1,&this->m_objects);
  }
  else {
    sVar4 = xr_reader::find_chunk(pxStack_18,5);
    pxVar1 = pxStack_18;
    if (sVar4 != 0) {
      uVar3 = xr_reader::r_u32(pxStack_18);
      xr_reader::
      r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
                (pxVar1,uVar3,&this->m_open_objects);
    }
  }
  bVar2 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
          empty(&this->m_objects);
  local_31 = 1;
  if (bVar2) {
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->m_open_objects);
    local_31 = bVar2 ^ 0xff;
  }
  if ((local_31 & 1) != 0) {
    sVar4 = xr_reader::find_chunk(pxStack_18,4);
    if (sVar4 != 0) {
      xr_reader::r_sz(pxStack_18,&this->m_reference);
      xr_reader::debug_find_chunk(pxStack_18);
    }
    return;
  }
  __assert_fail("!m_objects.empty() || !m_open_objects.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_groups.cxx"
                ,0x1c,"virtual void xray_re::xr_group_object::load(xr_reader &)");
}

Assistant:

void xr_group_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(GROUPOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == GROUPOBJ_VERSION);
	xr_custom_object::load(r);
	r.r_chunk<uint32_t>(GROUPOBJ_CHUNK_FLAGS, m_flags);
	if (m_flags & GOF_OPEN) {
		if (r.find_chunk(GROUPOBJ_CHUNK_OPEN_OBJECT_LIST))
			r.r_seq(r.r_u32(), m_open_objects, xr_reader::f_r_sz());
	} else {
		scene().load_objects(r, GROUPOBJ_CHUNK_OBJECTS, m_objects);
	}
	xr_assert(!m_objects.empty() || !m_open_objects.empty());
	if (r.find_chunk(GROUPOBJ_CHUNK_REFERENCE)) {
		r.r_sz(m_reference);
		r.debug_find_chunk();
	}
}